

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecs.cpp
# Opt level: O3

void __thiscall codecs_base64_decode_buffer_Test::TestBody(codecs_base64_decode_buffer_Test *this)

{
  char *pcVar1;
  char tight_buffer [4];
  char buffer [64];
  AssertHelper local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  char acStack_a8 [16];
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  AssertHelperData AStack_88;
  pointer pcStack_50;
  size_type local_48;
  size_type sStack_40;
  
  AStack_88._16_8_ = AStack_88._16_8_ & 0xffffffff00000000;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_c8.data_ = (AssertHelperData *)0x0;
  local_b8 = (undefined1  [8])acStack_a8;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_98,"0","ST::base64_decode(ST::string(), nullptr, 0)",&AStack_88.line,
             (long *)&local_c8);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xed,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  AStack_88._16_8_ = AStack_88._16_8_ & 0xffffffff00000000;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])acStack_a8;
  local_c8.data_ =
       (AssertHelperData *)
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_98,"0","ST::base64_decode(ST::string(), buffer, sizeof(buffer))",
             &AStack_88.line,(long *)&local_c8);
  if ((0xf < local_b0) && (local_b8 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xee,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  AStack_88.type._0_1_ = kSuccess;
  AStack_88.type._1_1_ = kSuccess >> 8;
  AStack_88.type._2_1_ = kSuccess >> 0x10;
  AStack_88._3_4_ = 0;
  AStack_88._7_1_ = '\0';
  local_b8 = (undefined1  [8])acStack_a8;
  local_98 = (undefined1  [8])&AStack_88;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,"ST::char_buffer(reinterpret_cast<const char *>(data_empty), 0)",
             "ST::char_buffer(buffer, 0)",(buffer<char> *)local_b8,(buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_b0
      ) && ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_b8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xef,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_98 = (undefined1  [8])&DAT_00000030;
  local_c8.data_ = (AssertHelperData *)&DAT_00000030;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_b8,"static_cast<ST_ssize_t>(sizeof(data_base64_ranges))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\" \"\", sizeof(\"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\") - 1), nullptr, 0)"
             ,(long *)local_98,(long *)&local_c8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xf3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8.data_ = (AssertHelperData *)&DAT_00000030;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])operator_new__(0x41);
  *(undefined8 *)local_b8 = 0x4847464544434241;
  *(undefined8 *)((long)local_b8 + 8) = 0x504f4e4d4c4b4a49;
  *(undefined8 *)((long)local_b8 + 0x10) = 0x5857565554535251;
  *(undefined8 *)((long)local_b8 + 0x18) = 0x6665646362615a59;
  *(undefined8 *)((long)local_b8 + 0x20) = 0x6e6d6c6b6a696867;
  *(undefined8 *)((long)local_b8 + 0x28) = 0x767574737271706f;
  *(undefined8 *)((long)local_b8 + 0x30) = 0x333231307a797877;
  *(undefined8 *)((long)local_b8 + 0x38) = 0x2f2b393837363534;
  *(char *)((long)local_b8 + 0x40) = '\0';
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_base64_ranges))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\" \"\", sizeof(\"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\") - 1), buffer, sizeof(buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xf6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])operator_new__(0x31);
  *(undefined8 *)local_b8 = 0x9220875110831000;
  *(undefined8 *)((long)local_b8 + 8) = 0x519314418fd3308b;
  *(undefined8 *)((long)local_b8 + 0x10) = 0x9fd7719b96619755;
  *(undefined8 *)((long)local_b8 + 0x18) = 0x9aa2a75992a31882;
  *(undefined8 *)((long)local_b8 + 0x20) = 0xd3b31cc3afdbb2ab;
  *(undefined8 *)((long)local_b8 + 0x28) = 0xbfdff3bb9ee3b75d;
  *(uchar *)((long)local_b8 + 0x30) = '\0';
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000030;
  AStack_88.type._0_1_ = kSuccess;
  AStack_88.type._1_1_ = kSuccess >> 8;
  AStack_88.type._2_1_ = kSuccess >> 0x10;
  AStack_88._3_4_ = 0;
  AStack_88._7_1_ = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  local_98 = (undefined1  [8])operator_new__(0x31);
  (((AssertHelperData *)local_98)->message)._M_string_length = local_48;
  (((AssertHelperData *)local_98)->message).field_2._M_allocated_capacity = sStack_40;
  *(ulong *)&((AssertHelperData *)local_98)->line =
       CONCAT71(AStack_88.message.field_2._9_7_,AStack_88.message.field_2._M_local_buf[8]);
  (((AssertHelperData *)local_98)->message)._M_dataplus._M_p = pcStack_50;
  *(ulong *)local_98 =
       CONCAT17(AStack_88.message._M_string_length._7_1_,
                CONCAT43(AStack_88.message._M_string_length._3_4_,
                         CONCAT12(AStack_88.message._M_string_length._2_1_,
                                  CONCAT11(AStack_88.message._M_string_length._1_1_,
                                           (undefined1)AStack_88.message._M_string_length))));
  ((AssertHelperData *)local_98)->file =
       (char *)CONCAT17(AStack_88.message.field_2._M_local_buf[7],
                        AStack_88.message.field_2._M_allocated_capacity._0_7_);
  (((AssertHelperData *)local_98)->message).field_2._M_local_buf[8] = '\0';
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_base64_ranges), sizeof((data_base64_ranges)))"
             ,"ST::char_buffer(buffer, sizeof(data_base64_ranges))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if ((0xf < local_b0) && (local_b8 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xf7,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_c8.data_ = (AssertHelperData *)&DAT_00000004;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  builtin_strncpy(acStack_a8,"AQIDBA==",9);
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  AStack_88.line = 4;
  AStack_88._20_4_ = 0;
  local_b8 = (undefined1  [8])acStack_a8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(tight_buffer))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBA==\" \"\", sizeof(\"AQIDBA==\") - 1), nullptr, 0)"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xfb,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_c8.data_ = (AssertHelperData *)&DAT_00000004;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  builtin_strncpy(acStack_a8,"AQIDBA==",9);
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])acStack_a8;
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode
                 ((string *)local_b8,(void *)((long)&AStack_88.message._M_dataplus._M_p + 4),4);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(tight_buffer))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBA==\" \"\", sizeof(\"AQIDBA==\") - 1), tight_buffer, sizeof(tight_buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xfd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  builtin_strncpy(acStack_a8,"\x01\x02\x03\x04",5);
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  AStack_88._7_1_ = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  AStack_88.type._0_1_ = (undefined1)AStack_88.message._M_dataplus._M_p._4_4_;
  AStack_88.type._1_1_ = (undefined1)(AStack_88.message._M_dataplus._M_p._4_4_ >> 8);
  AStack_88.type._2_1_ = (undefined1)(AStack_88.message._M_dataplus._M_p._4_4_ >> 0x10);
  AStack_88._3_4_ = AStack_88.message._M_dataplus._M_p._4_4_ >> 0x18;
  local_b8 = (undefined1  [8])acStack_a8;
  local_98 = (undefined1  [8])&AStack_88;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_4), sizeof((data_4)))",
             "ST::char_buffer(tight_buffer, sizeof(tight_buffer))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xfe,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_c8.data_ = (AssertHelperData *)0x1;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  builtin_strncpy(acStack_a8,"AQ==",5);
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  AStack_88.line = 1;
  AStack_88._20_4_ = 0;
  local_b8 = (undefined1  [8])acStack_a8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_1))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQ==\" \"\", sizeof(\"AQ==\") - 1), nullptr, 0)"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x101,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_c8.data_ = (AssertHelperData *)0x1;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  builtin_strncpy(acStack_a8,"AQ==",5);
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])acStack_a8;
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_1))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQ==\" \"\", sizeof(\"AQ==\") - 1), buffer, sizeof(buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x103,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  acStack_a8[0] = '\x01';
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  AStack_88.type._1_1_ = kSuccess >> 8;
  AStack_88.type._2_1_ = kSuccess >> 0x10;
  AStack_88._3_4_ = 0;
  AStack_88._7_1_ = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  AStack_88.type._0_1_ = (undefined1)AStack_88.message._M_string_length;
  local_b8 = (undefined1  [8])acStack_a8;
  local_98 = (undefined1  [8])&AStack_88;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_1), sizeof((data_1)))",
             "ST::char_buffer(buffer, sizeof(data_1))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x104,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_c8.data_ = (AssertHelperData *)0x2;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  builtin_strncpy(acStack_a8,"AQI=",5);
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  AStack_88.line = 2;
  AStack_88._20_4_ = 0;
  local_b8 = (undefined1  [8])acStack_a8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_2))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQI=\" \"\", sizeof(\"AQI=\") - 1), nullptr, 0)"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x106,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_c8.data_ = (AssertHelperData *)0x2;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  builtin_strncpy(acStack_a8,"AQI=",5);
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])acStack_a8;
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_2))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQI=\" \"\", sizeof(\"AQI=\") - 1), buffer, sizeof(buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x108,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  acStack_a8[0] = '\x01';
  acStack_a8[1] = '\x02';
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  AStack_88.type._2_1_ = kSuccess >> 0x10;
  AStack_88._3_4_ = 0;
  AStack_88._7_1_ = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  local_b8 = (undefined1  [8])acStack_a8;
  local_98 = (undefined1  [8])&AStack_88;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_2), sizeof((data_2)))",
             "ST::char_buffer(buffer, sizeof(data_2))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x109,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_c8.data_ = (AssertHelperData *)0x3;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  builtin_strncpy(acStack_a8,"AQID",5);
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  AStack_88.line = 3;
  AStack_88._20_4_ = 0;
  local_b8 = (undefined1  [8])acStack_a8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_3))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQID\" \"\", sizeof(\"AQID\") - 1), nullptr, 0)"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x10b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_c8.data_ = (AssertHelperData *)0x3;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  builtin_strncpy(acStack_a8,"AQID",5);
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])acStack_a8;
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_3))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQID\" \"\", sizeof(\"AQID\") - 1), buffer, sizeof(buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x10d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  builtin_strncpy(acStack_a8,"\x01\x02\x03",4);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  AStack_88._7_1_ = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  AStack_88.type._2_1_ = AStack_88.message._M_string_length._2_1_;
  AStack_88._3_4_ = 0;
  local_b8 = (undefined1  [8])acStack_a8;
  local_98 = (undefined1  [8])&AStack_88;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_3), sizeof((data_3)))",
             "ST::char_buffer(buffer, sizeof(data_3))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_b0
      ) && ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_b8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x10e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_98 = (undefined1  [8])&DAT_0000000f;
  local_c8.data_ = (AssertHelperData *)&DAT_0000000f;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_b8,"static_cast<ST_ssize_t>(sizeof(data_15))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4P\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4P\") - 1), nullptr, 0)"
             ,(long *)local_98,(long *)&local_c8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x111,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8.data_ = (AssertHelperData *)&DAT_0000000f;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])operator_new__(0x15);
  *(undefined8 *)local_b8 = 0x4755414244495141;
  *(undefined8 *)((long)local_b8 + 8) = 0x4d7367434a677742;
  *(undefined4 *)((long)local_b8 + 0x10) = 0x50345144;
  *(char *)((long)local_b8 + 0x14) = '\0';
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_15))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4P\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4P\") - 1), buffer, sizeof(buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x113,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f;
  builtin_strncpy(acStack_a8,"\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f",0x10);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f;
  AStack_88.file._0_4_ = (undefined4)AStack_88.message.field_2._M_allocated_capacity._0_7_;
  AStack_88.file._4_4_ = (uint)(uint3)((uint7)AStack_88.message.field_2._0_7_ >> 0x20);
  local_b8 = (undefined1  [8])acStack_a8;
  local_98 = (undefined1  [8])&AStack_88;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_15), sizeof((data_15)))",
             "ST::char_buffer(buffer, sizeof(data_15))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_b0
      ) && ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_b8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x114,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_98 = (undefined1  [8])&DAT_00000010;
  local_c8.data_ = (AssertHelperData *)&DAT_00000010;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_b8,"static_cast<ST_ssize_t>(sizeof(data_16))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEA==\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEA==\") - 1), nullptr, 0)"
             ,(long *)local_98,(long *)&local_c8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x116,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8.data_ = (AssertHelperData *)&DAT_00000010;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])operator_new__(0x19);
  *(undefined8 *)local_b8 = 0x4755414244495141;
  *(undefined8 *)((long)local_b8 + 8) = 0x4d7367434a677742;
  *(long *)((long)local_b8 + 0x10) = 0x3d3d414550345144;
  *(char *)((long)local_b8 + 0x18) = '\0';
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_16))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEA==\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEA==\") - 1), buffer, sizeof(buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x118,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_b8 = 0x807060504030201;
  *(undefined8 *)((long)local_b8 + 8) = 0x100f0e0d0c0b0a09;
  *(uchar *)((long)local_b8 + 0x10) = '\0';
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
  AStack_88.type._0_1_ = kSuccess;
  AStack_88.type._1_1_ = kSuccess >> 8;
  AStack_88.type._2_1_ = kSuccess >> 0x10;
  AStack_88._3_4_ = 0;
  AStack_88._7_1_ = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  local_98 = (undefined1  [8])operator_new__(0x11);
  *(ulong *)local_98 =
       CONCAT17(AStack_88.message._M_string_length._7_1_,
                CONCAT43(AStack_88.message._M_string_length._3_4_,
                         CONCAT12(AStack_88.message._M_string_length._2_1_,
                                  CONCAT11(AStack_88.message._M_string_length._1_1_,
                                           (undefined1)AStack_88.message._M_string_length))));
  ((AssertHelperData *)local_98)->file =
       (char *)CONCAT17(AStack_88.message.field_2._M_local_buf[7],
                        AStack_88.message.field_2._M_allocated_capacity._0_7_);
  *(undefined1 *)&((AssertHelperData *)local_98)->line = 0;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_16), sizeof((data_16)))",
             "ST::char_buffer(buffer, sizeof(data_16))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_90
      ) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_b0
      ) && (local_b8 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x119,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_98 = (undefined1  [8])&DAT_00000011;
  local_c8.data_ = (AssertHelperData *)&DAT_00000011;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_b8,"static_cast<ST_ssize_t>(sizeof(data_17))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEBE=\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEBE=\") - 1), nullptr, 0)"
             ,(long *)local_98,(long *)&local_c8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x11b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8.data_ = (AssertHelperData *)&DAT_00000011;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])operator_new__(0x19);
  *(undefined8 *)local_b8 = 0x4755414244495141;
  *(undefined8 *)((long)local_b8 + 8) = 0x4d7367434a677742;
  *(long *)((long)local_b8 + 0x10) = 0x3d45424550345144;
  *(char *)((long)local_b8 + 0x18) = '\0';
  AStack_88._16_8_ =
       _ST_PRIVATE::b64_decode((string *)local_b8,&AStack_88.message._M_string_length,0x40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_98,"static_cast<ST_ssize_t>(sizeof(data_17))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEBE=\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEBE=\") - 1), buffer, sizeof(buffer))"
             ,(long *)&local_c8,(long *)&AStack_88.line);
  if ((0xf < local_b0) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
  {
    operator_delete__((void *)local_b8);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x11d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11;
  acStack_a8[0] = '\0';
  acStack_a8[1] = '\0';
  acStack_a8[2] = '\0';
  acStack_a8[3] = '\0';
  acStack_a8[4] = '\0';
  acStack_a8[5] = '\0';
  acStack_a8[6] = '\0';
  acStack_a8[7] = '\0';
  acStack_a8[8] = '\0';
  acStack_a8[9] = '\0';
  acStack_a8[10] = '\0';
  acStack_a8[0xb] = '\0';
  acStack_a8[0xc] = '\0';
  acStack_a8[0xd] = '\0';
  acStack_a8[0xe] = '\0';
  acStack_a8[0xf] = '\0';
  local_b8 = (undefined1  [8])operator_new__(0x12);
  *(undefined8 *)local_b8 = 0x807060504030201;
  *(undefined8 *)((long)local_b8 + 8) = 0x100f0e0d0c0b0a09;
  *(undefined2 *)((long)local_b8 + 0x10) = 0x11;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11;
  AStack_88.type._0_1_ = kSuccess;
  AStack_88.type._1_1_ = kSuccess >> 8;
  AStack_88.type._2_1_ = kSuccess >> 0x10;
  AStack_88._3_4_ = 0;
  AStack_88._7_1_ = '\0';
  AStack_88.file._0_1_ = '\0';
  AStack_88.file._1_1_ = '\0';
  AStack_88.file._2_1_ = '\0';
  AStack_88.file._3_1_ = '\0';
  AStack_88.file._4_1_ = '\0';
  AStack_88.file._5_1_ = '\0';
  AStack_88.file._6_1_ = '\0';
  AStack_88.file._7_1_ = '\0';
  local_98 = (undefined1  [8])operator_new__(0x12);
  *(char *)&((AssertHelperData *)local_98)->line = AStack_88.message.field_2._M_local_buf[8];
  *(ulong *)local_98 =
       CONCAT17(AStack_88.message._M_string_length._7_1_,
                CONCAT43(AStack_88.message._M_string_length._3_4_,
                         CONCAT12(AStack_88.message._M_string_length._2_1_,
                                  CONCAT11(AStack_88.message._M_string_length._1_1_,
                                           (undefined1)AStack_88.message._M_string_length))));
  ((AssertHelperData *)local_98)->file =
       (char *)CONCAT17(AStack_88.message.field_2._M_local_buf[7],
                        AStack_88.message.field_2._M_allocated_capacity._0_7_);
  *(undefined1 *)((long)&((AssertHelperData *)local_98)->line + 1) = 0;
  testing::internal::CmpHelperEQ<ST::buffer<char>,ST::buffer<char>>
            ((internal *)&local_c8,
             "ST::char_buffer(reinterpret_cast<const char *>(data_17), sizeof((data_17)))",
             "ST::char_buffer(buffer, sizeof(data_17))",(buffer<char> *)local_b8,
             (buffer<char> *)local_98);
  if ((0xf < local_90) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if ((0xf < local_b0) && (local_b8 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (local_c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x11e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  return;
}

Assistant:

TEST(codecs, base64_decode_buffer)
{
    char buffer[64];

    EXPECT_EQ(0, ST::base64_decode(ST::string(), nullptr, 0));
    EXPECT_EQ(0, ST::base64_decode(ST::string(), buffer, sizeof(buffer)));
    EXPECT_EQ(empty_buf, ST::char_buffer(buffer, 0));

    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_base64_ranges)),
        ST::base64_decode(ST_LITERAL("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"),
                          nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_base64_ranges)),
        ST::base64_decode(ST_LITERAL("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"),
                          buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_base64_ranges), ST::char_buffer(buffer, sizeof(data_base64_ranges)));

    char tight_buffer[4];
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(tight_buffer)),
              ST::base64_decode(ST_LITERAL("AQIDBA=="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(tight_buffer)),
              ST::base64_decode(ST_LITERAL("AQIDBA=="), tight_buffer, sizeof(tight_buffer)));
    EXPECT_EQ(cbuf(data_4), ST::char_buffer(tight_buffer, sizeof(tight_buffer)));

    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_1)),
              ST::base64_decode(ST_LITERAL("AQ=="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_1)),
              ST::base64_decode(ST_LITERAL("AQ=="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_1), ST::char_buffer(buffer, sizeof(data_1)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_2)),
              ST::base64_decode(ST_LITERAL("AQI="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_2)),
              ST::base64_decode(ST_LITERAL("AQI="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_2), ST::char_buffer(buffer, sizeof(data_2)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_3)),
              ST::base64_decode(ST_LITERAL("AQID"), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_3)),
              ST::base64_decode(ST_LITERAL("AQID"), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_3), ST::char_buffer(buffer, sizeof(data_3)));

    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_15)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4P"), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_15)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4P"), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_15), ST::char_buffer(buffer, sizeof(data_15)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_16)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEA=="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_16)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEA=="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_16), ST::char_buffer(buffer, sizeof(data_16)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_17)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEBE="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_17)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEBE="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_17), ST::char_buffer(buffer, sizeof(data_17)));
}